

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Opt::Opt(Opt *this,bool *ref)

{
  shared_ptr<Catch::Clara::Detail::BoundFlagRef> local_38;
  shared_ptr<Catch::Clara::Detail::BoundRef> local_28;
  bool *local_18;
  bool *ref_local;
  Opt *this_local;
  
  local_18 = ref;
  ref_local = (bool *)this;
  std::make_shared<Catch::Clara::Detail::BoundFlagRef,bool&>((bool *)&local_38);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::
  shared_ptr<Catch::Clara::Detail::BoundFlagRef,void>(&local_28,&local_38);
  Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            (&this->super_ParserRefImpl<Catch::Clara::Opt>,&local_28);
  std::shared_ptr<Catch::Clara::Detail::BoundRef>::~shared_ptr(&local_28);
  std::shared_ptr<Catch::Clara::Detail::BoundFlagRef>::~shared_ptr(&local_38);
  (this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Opt_003e6ec0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_optNames);
  return;
}

Assistant:

Opt::Opt(bool &ref) :
            ParserRefImpl(std::make_shared<Detail::BoundFlagRef>(ref)) {}